

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O3

void __thiscall OPL_DOSBOXdump::WriteReg(OPL_DOSBOXdump *this,int reg,int v)

{
  BYTE BVar1;
  FILE *__stream;
  ulong uVar2;
  BYTE cmd [3];
  undefined1 local_1b [3];
  
  __stream = (FILE *)(this->super_OPLDump).File;
  if (__stream != (FILE *)0x0) {
    BVar1 = (BYTE)((uint)reg >> 8);
    if ((this->super_OPLDump).CurChip != BVar1) {
      (this->super_OPLDump).CurChip = BVar1;
      fputc(((uint)reg >> 8 & 0xff) + 2,__stream);
      __stream = (FILE *)(this->super_OPLDump).File;
    }
    local_1b[0] = 4;
    local_1b[2] = (undefined1)v;
    uVar2 = (ulong)(4 < (reg & 0xffU));
    local_1b[1] = (char)reg;
    fwrite(local_1b + uVar2,1,uVar2 ^ 3,__stream);
    return;
  }
  __assert_fail("File != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/music_opldumper_mididevice.cpp"
                ,0xd6,"virtual void OPL_DOSBOXdump::WriteReg(int, int)");
}

Assistant:

virtual void WriteReg(int reg, int v)
	{
		assert(File != NULL);
		BYTE chipnum = reg >> 8;
		if (chipnum != CurChip)
		{
			CurChip = chipnum;
			fputc(chipnum + 2, File);
		}
		reg &= 255;
		BYTE cmd[3] = { 4, BYTE(reg), BYTE(v) };
		fwrite (cmd + (reg > 4), 1, 3 - (reg > 4), File);
	}